

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

void tt_delta_interpolate
               (int p1,int p2,int ref1,int ref2,FT_Vector *in_points,FT_Vector *out_points)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  FT_Long FVar6;
  long lVar7;
  FT_Vector *pFVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  FT_Vector *pFVar15;
  FT_Vector *local_38;
  
  if (p1 <= p2) {
    lVar7 = (long)p1;
    pFVar15 = in_points + lVar7;
    pFVar8 = out_points + lVar7;
    lVar5 = 8;
    local_38 = out_points;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      in_points = (FT_Vector *)(&in_points->x + lVar11);
      iVar9 = ref2;
      if (in_points[ref2].x < in_points[ref1].x) {
        iVar9 = ref1;
      }
      local_38 = (FT_Vector *)(&local_38->x + lVar11);
      if (in_points[ref2].x < in_points[ref1].x) {
        ref1 = ref2;
      }
      lVar1 = in_points[ref1].x;
      lVar2 = in_points[iVar9].x;
      lVar3 = local_38[ref1].x;
      lVar4 = local_38[iVar9].x;
      if ((lVar2 != lVar1) || (lVar4 == lVar3)) {
        if (lVar2 - lVar1 == 0) {
          lVar13 = 0;
        }
        else {
          FVar6 = FT_DivFix(lVar4 - lVar3,lVar2 - lVar1);
          lVar13 = (long)(int)FVar6;
        }
        lVar14 = 0;
        for (lVar10 = lVar7; lVar10 <= p2; lVar10 = lVar10 + 1) {
          lVar12 = *(long *)((long)&pFVar15->x + lVar14);
          if (lVar1 < lVar12) {
            if (lVar12 < lVar2) {
              lVar12 = ((int)lVar12 - (int)lVar1) * lVar13;
              lVar12 = (int)((ulong)(lVar12 + (lVar12 >> 0x3f) + 0x8000) >> 0x10) + lVar3;
            }
            else {
              lVar12 = lVar12 + (lVar4 - lVar2);
            }
          }
          else {
            lVar12 = lVar12 + (lVar3 - lVar1);
          }
          *(long *)((long)&pFVar8->x + lVar14) = lVar12;
          lVar14 = lVar14 + 0x10;
        }
      }
      pFVar15 = (FT_Vector *)((long)&pFVar15->x + lVar5);
      pFVar8 = (FT_Vector *)((long)&pFVar8->x + lVar5);
      lVar5 = lVar5 + 8;
      ref2 = iVar9;
    }
  }
  return;
}

Assistant:

static void
  tt_delta_interpolate( int         p1,
                        int         p2,
                        int         ref1,
                        int         ref2,
                        FT_Vector*  in_points,
                        FT_Vector*  out_points )
  {
    int  p, i;

    FT_Pos  out, in1, in2, out1, out2, d1, d2;


    if ( p1 > p2 )
      return;

    /* handle both horizontal and vertical coordinates */
    for ( i = 0; i <= 1; i++ )
    {
      /* shift array pointers so that we can access `foo.y' as `foo.x' */
      in_points  = (FT_Vector*)( (FT_Pos*)in_points + i );
      out_points = (FT_Vector*)( (FT_Pos*)out_points + i );

      if ( in_points[ref1].x > in_points[ref2].x )
      {
        p    = ref1;
        ref1 = ref2;
        ref2 = p;
      }

      in1  = in_points[ref1].x;
      in2  = in_points[ref2].x;
      out1 = out_points[ref1].x;
      out2 = out_points[ref2].x;
      d1   = out1 - in1;
      d2   = out2 - in2;

      /* If the reference points have the same coordinate but different */
      /* delta, inferred delta is zero.  Otherwise interpolate.         */
      if ( in1 != in2 || out1 == out2 )
      {
        FT_Fixed  scale = in1 != in2 ? FT_DivFix( out2 - out1, in2 - in1 )
                                     : 0;


        for ( p = p1; p <= p2; p++ )
        {
          out = in_points[p].x;

          if ( out <= in1 )
            out += d1;
          else if ( out >= in2 )
            out += d2;
          else
            out = out1 + FT_MulFix( out - in1, scale );

          out_points[p].x = out;
        }
      }
    }
  }